

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGCG_Solver.cpp
# Opt level: O2

void __thiscall BGCG_Solver::BGCG_Solver(BGCG_Solver *this,BGCG_constPtr *bg,size_t nrSolutions)

{
  int *piVar1;
  sp_counted_base *psVar2;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_28;
  
  local_28.px = &bg->px->super_BayesianGameIdenticalPayoffInterface;
  local_28.pn.pi_ = (bg->pn).pi_;
  psVar2 = (bg->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  BayesianGameIdenticalPayoffSolver::BayesianGameIdenticalPayoffSolver
            (&this->super_BayesianGameIdenticalPayoffSolver,&local_28,nrSolutions);
  boost::detail::shared_count::~shared_count(&local_28.pn);
  (this->super_BayesianGameIdenticalPayoffSolver)._vptr_BayesianGameIdenticalPayoffSolver =
       (_func_int **)&PTR_InitDeadline_005d5890;
  boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::shared_ptr(&this->_m_bgcg,bg);
  return;
}

Assistant:

BGCG_Solver::BGCG_Solver(const BGCG_constPtr &bg, size_t nrSolutions):
    BayesianGameIdenticalPayoffSolver(bg, nrSolutions),
    _m_bgcg(bg)
{
}